

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueSamplerCase::test
          (UniformValueSamplerCase *this)

{
  CallLogWrapper *this_00;
  RenderContext *renderCtx;
  GLint location;
  GLint in_R8D;
  long lVar1;
  ShaderProgram program;
  ProgramSources sources;
  value_type local_210;
  value_type local_1f0;
  ShaderProgram local_1d0;
  ProgramSources local_100;
  
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"void main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "uniform highp sampler2D uniformSampler;\nvoid main (void)\n{\n\tgl_FragColor = vec4(texture2D(uniformSampler, vec2(0.0, 0.0)).x);\n}\n"
             ,"");
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,&local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,&local_210);
  glu::ShaderProgram::ShaderProgram(&local_1d0,renderCtx,&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar1 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0.m_program.m_info.linkOk == false) {
    glu::operator<<((this->super_ApiCase).m_log,&local_1d0);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  else {
    this_00 = &(this->super_ApiCase).super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,local_1d0.m_program.m_program);
    ApiCase::expectError(&this->super_ApiCase,0);
    location = glu::CallLogWrapper::glGetUniformLocation
                         (this_00,local_1d0.m_program.m_program,"uniformSampler");
    glu::CallLogWrapper::glUniform1i(this_00,location,1);
    verifyUniformValue1i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,location,in_R8D);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  glu::ShaderProgram::~ShaderProgram(&local_1d0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"}\n";
		static const char* testFragSource =
			"uniform highp sampler2D uniformSampler;\n"

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(texture2D(uniformSampler, vec2(0.0, 0.0)).x);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		location = glGetUniformLocation(program.getProgram(), "uniformSampler");
		glUniform1i(location, 1);
		verifyUniformValue1i(m_testCtx, *this, program.getProgram(), location, 1);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}